

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_update<char,false,5>
          (immutable *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t index,char element)

{
  uint32_t uVar1;
  rrb<char,_false,_5> *prVar2;
  leaf_node<char,_false> *plVar3;
  internal_node<char,_false> *piVar4;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_78;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_70;
  ref<immutable::rrb_details::leaf_node<char,_false>_> leaf;
  uint32_t child_index;
  uint32_t local_54;
  ref<immutable::rrb_details::internal_node<char,_false>_> rStack_50;
  uint32_t shift;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::internal_node<char,_false>_> *previous_pointer;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_30;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  uint32_t tail_offset;
  char element_local;
  ref<immutable::rrb<char,_false,_5>_> *prStack_18;
  uint32_t index_local;
  ref<immutable::rrb<char,_false,_5>_> *in_local;
  ref<immutable::rrb<char,_false,_5>_> *new_rrb;
  
  tail_offset = index;
  prStack_18 = in;
  in_local = (ref<immutable::rrb<char,_false,_5>_> *)this;
  prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
  if (prVar2->cnt <= index) {
    __assert_fail("index < in->cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x79b,
                  "ref<rrb<T, atomic_ref_counting, N>> immutable::rrb_update(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t, T) [T = char, atomic_ref_counting = false, N = 5]"
                 );
  }
  prVar2 = rrb_details::rrb_head_clone<char,false,5>(prStack_18->ptr);
  ref<immutable::rrb<char,_false,_5>_>::ref((ref<immutable::rrb<char,_false,_5>_> *)this,prVar2);
  prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(prStack_18);
  uVar1 = prVar2->cnt;
  prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(prStack_18);
  new_tail.ptr._4_4_ = uVar1 - prVar2->tail_len;
  if (tail_offset < new_tail.ptr._4_4_) {
    prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)this);
    current.ptr = (internal_node<char,_false> *)&prVar2->root;
    prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(prStack_18);
    ref<immutable::rrb_details::internal_node<char,false>>::
    ref<immutable::rrb_details::tree_node<char,false>>
              ((ref<immutable::rrb_details::internal_node<char,false>> *)&stack0xffffffffffffffb0,
               &prVar2->root);
    prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(prStack_18);
    for (local_54 = prVar2->shift; local_54 != 0; local_54 = local_54 - 5) {
      piVar4 = rrb_details::internal_node_clone<char,false>(rStack_50.ptr);
      ref<immutable::rrb_details::internal_node<char,_false>_>::ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffffa0,piVar4);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (&stack0xffffffffffffffb0,
                 (ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffffa0);
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                 &stack0xffffffffffffffa0);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_false>_> *)current.ptr,
                 &stack0xffffffffffffffb0);
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (&stack0xffffffffffffffb0);
      if ((piVar4->size_table).ptr == (rrb_size_table<false> *)0x0) {
        leaf.ptr._4_4_ = tail_offset >> ((byte)local_54 & 0x1f) & 0x1f;
      }
      else {
        leaf.ptr._4_4_ = rrb_details::sized_pos<char,false>(rStack_50.ptr,&tail_offset,local_54);
      }
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (&stack0xffffffffffffffb0);
      current.ptr = (internal_node<char,_false> *)(piVar4->child + leaf.ptr._4_4_);
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                         (&stack0xffffffffffffffb0);
      ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                (&stack0xffffffffffffffb0,piVar4->child + leaf.ptr._4_4_);
    }
    ref<immutable::rrb_details::leaf_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::leaf_node<char,false>> *)&local_70,
               &stack0xffffffffffffffb0);
    plVar3 = rrb_details::leaf_node_clone<char,false>(local_70.ptr);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(&local_78,plVar3);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&local_70,&local_78);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_78);
    ref<immutable::rrb_details::internal_node<char,false>>::operator=
              ((ref<immutable::rrb_details::internal_node<char,false>> *)current.ptr,&local_70);
    plVar3 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_70);
    plVar3->child[tail_offset & 0x1f] = element;
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_70);
    ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&stack0xffffffffffffffb0);
  }
  else {
    prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->(prStack_18);
    plVar3 = rrb_details::leaf_node_clone<char,false>((prVar2->tail).ptr);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(&local_30,plVar3);
    plVar3 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_30);
    plVar3->child[tail_offset - new_tail.ptr._4_4_] = element;
    prVar2 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)this);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar2->tail,&local_30);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_30);
  }
  return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_update(const ref<rrb<T, atomic_ref_counting, N>>& in, uint32_t index, T element)
    {
    using namespace rrb_details;
    assert(index < in->cnt);
    ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
    const uint32_t tail_offset = in->cnt - in->tail_len;
    if (tail_offset <= index)
      {
      ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_clone(in->tail.ptr);
      new_tail->child[index - tail_offset] = std::move(element);
      new_rrb->tail = new_tail;
      return new_rrb;
      }
    ref<internal_node<T, atomic_ref_counting>>* previous_pointer = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
    ref<internal_node<T, atomic_ref_counting>> current = in->root;
    for (uint32_t shift = in->shift; shift > 0; shift -= bits<N>::rrb_bits)
      {
      current = internal_node_clone(current.ptr);
      *previous_pointer = current;

      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        child_index = (index >> shift) & bits<N>::rrb_mask;
        }
      else
        {
        child_index = sized_pos(current.ptr, &index, shift);
        }
      previous_pointer = &current->child[child_index];
      current = current->child[child_index];
      }
    ref<leaf_node<T, atomic_ref_counting>> leaf = current;
    leaf = leaf_node_clone(leaf.ptr);
    *previous_pointer = leaf;
    leaf->child[index & bits<N>::rrb_mask] = std::move(element);
    return new_rrb;
    }